

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O1

float ImNodes::GetDistanceToLineSquared(ImVec2 *point,ImVec2 *a,ImVec2 *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar2 = a->x;
  fVar4 = a->y;
  fVar1 = b->x - fVar2;
  fVar3 = b->y - fVar4;
  fVar5 = ((point->x - fVar2) * fVar1 + (point->y - fVar4) * fVar3) /
          (fVar1 * fVar1 + fVar3 * fVar3);
  fVar6 = 1.0;
  if ((fVar5 <= 1.0) && (fVar6 = fVar5, fVar5 < 0.0)) {
    fVar6 = 0.0;
  }
  fVar2 = (fVar1 * fVar6 + fVar2) - point->x;
  fVar4 = (fVar3 * fVar6 + fVar4) - point->y;
  return fVar2 * fVar2 + fVar4 * fVar4;
}

Assistant:

float GetDistanceToLineSquared(const ImVec2& point, const ImVec2& a, const ImVec2& b)
{
    float tx, ty, t, u;
    tx = b.x - a.x;
    ty = b.y - a.y;
    t = (tx * tx) + (ty * ty);
    u = ((point.x - a.x) * tx + (point.y - a.y) * ty) / t;
    if (u > 1)
        u = 1;
    else if (u < 0)
        u = 0;
    tx = (a.x + u * tx) - point.x;
    ty = (a.y + u * ty) - point.y;
    return tx * tx + ty * ty;
}